

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deblock.c
# Opt level: O1

void deblock_edge_luma_ver(pel *src,int stride,int Alpha,int Beta,int edge_flag)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  byte bVar9;
  uint uVar10;
  byte *pbVar11;
  int iVar12;
  uint uVar13;
  uint local_50;
  
  iVar12 = stride * 4;
  if ((edge_flag & 1U) != 0) {
    iVar12 = 0;
  }
  iVar4 = (uint)((~edge_flag & 0x101U) == 0) * 4 + 4;
  pbVar11 = src + iVar12;
  iVar12 = Beta + 3;
  if (-1 < Beta) {
    iVar12 = Beta;
  }
  uVar5 = iVar12 >> 2;
  while( true ) {
    bVar9 = pbVar11[-2];
    bVar1 = pbVar11[-1];
    bVar2 = *pbVar11;
    bVar3 = pbVar11[1];
    uVar6 = (uint)bVar2 - (uint)bVar1;
    uVar10 = -uVar6;
    if (0 < (int)uVar6) {
      uVar10 = uVar6;
    }
    uVar7 = (uint)bVar9 - (uint)bVar1;
    uVar6 = -uVar7;
    if (0 < (int)uVar7) {
      uVar6 = uVar7;
    }
    uVar8 = (uint)bVar2 - (uint)bVar3;
    uVar7 = -uVar8;
    if (0 < (int)uVar8) {
      uVar7 = uVar8;
    }
    uVar13 = (uint)pbVar11[-3] - (uint)bVar1;
    uVar8 = -uVar13;
    if (0 < (int)uVar13) {
      uVar8 = uVar13;
    }
    iVar12 = (uint)((int)(uVar8 & 0xff) < Beta) + (uint)((int)(uVar6 & 0xff) < Beta) * 2;
    uVar8 = (uint)bVar2 - (uint)pbVar11[2];
    uVar6 = -uVar8;
    if (0 < (int)uVar8) {
      uVar6 = uVar8;
    }
    uVar6 = ((uint)((int)(uVar6 & 0xff) < Beta) + iVar12 + (uint)((int)(uVar7 & 0xff) < Beta) * 2) -
            3;
    uVar8 = 0;
    switch(uVar6) {
    case 0:
      local_50 = (uint)bVar3;
      local_50 = bVar9 - local_50;
      uVar6 = -local_50;
      if (0 < (int)local_50) {
        uVar6 = local_50;
      }
      uVar8 = (uint)((int)uVar6 < Beta);
      break;
    case 1:
      uVar8 = (iVar12 == 2) + 1;
      break;
    case 2:
      uVar6 = (uint)(bVar3 ^ bVar2);
      bVar9 = bVar1 ^ bVar9 | bVar3 ^ bVar2;
      uVar10 = (uint)bVar9;
      uVar8 = bVar9 == 0 | 2;
      break;
    case 3:
      uVar8 = 3;
      uVar6 = uVar5;
      if ((int)(uVar7 & 0xff) <= (int)uVar5) {
        uVar6 = (uint)bVar1 - (uint)bVar9;
        uVar7 = -uVar6;
        if (0 < (int)uVar6) {
          uVar7 = uVar6;
        }
        if ((int)uVar7 <= (int)uVar5) {
          uVar10 = uVar10 & 0xff;
          uVar8 = ((int)uVar10 < Alpha) + 3;
        }
      }
    }
    if (uVar8 - 1 < 4) break;
    pbVar11 = pbVar11 + stride;
    iVar4 = iVar4 + -1;
    if (iVar4 == 0) {
      return;
    }
  }
  (*(code *)(&DAT_0017e950 + *(int *)(&DAT_0017e950 + (ulong)(uVar8 - 1) * 4)))
            (uVar10,uVar6,&DAT_0017e950 + *(int *)(&DAT_0017e950 + (ulong)(uVar8 - 1) * 4));
  return;
}

Assistant:

void deblock_edge_luma_ver(pel *src, int stride, int Alpha, int Beta, int edge_flag)
{
    int i, line_size = 8;

    if ((edge_flag & 0x0101) != 0x0101) {
        line_size = 4;
    }
    if (!(edge_flag & 0x1)) {
        src += 4 * stride;
    }

    for (i = 0; i < line_size; i++, src += stride) {
        int L3 = src[-4];
        int L2 = src[-3];
        int L1 = src[-2];
        int L0 = src[-1];
        int R0 = src[0];
        int R1 = src[1];
        int R2 = src[2];
        int R3 = src[3];
        int abs0 = COM_ABS(R0 - L0);
        int flat_l = (COM_ABS(L1 - L0) < Beta) ? 2 : 0;
        int flat_r = (COM_ABS(R0 - R1) < Beta) ? 2 : 0;
        int fs;

        if (COM_ABS(L2 - L0) < Beta) {
            flat_l++;
        }
        if (COM_ABS(R0 - R2) < Beta) {
            flat_r++;
        }

        switch (flat_l + flat_r) {
        case 6:
            fs = (COM_ABS(R0 - R1) <= Beta / 4 && COM_ABS(L0 - L1) <= Beta / 4 && abs0 < Alpha) ? 4 : 3;
            break;
        case 5:
            fs = (R1 == R0 && L0 == L1) ? 3 : 2;
            break;
        case 4:
            fs = (flat_l == 2) ? 2 : 1;
            break;
        case 3:
            fs = (COM_ABS(L1 - R1) < Beta) ? 1 : 0;
            break;
        default:
            fs = 0;
            break;
        }

        switch (fs) {
        case 4:
            src[-3] = (pel)((((L3 + L2 + L1) << 1) + L0 + R0 + 4) >> 3);                          //L2
            src[-2] = (pel)((((L2 + L0 + L1) << 2) + L1 + R0 * 3 + 8) >> 4);                      //L1
            src[-1] = (pel)(((L2 + R1) * 3 + ((L1 + L0 + R0) << 3) + (L0 << 1) + 16) >> 5);       //L0
            src[ 0] = (pel)(((R2 + L1) * 3 + ((R1 + R0 + L0) << 3) + (R0 << 1) + 16) >> 5);       //R0
            src[ 1] = (pel)((((R2 + R1 + R0) << 2) + R1 + L0 * 3 + 8) >> 4);                      //R1
            src[ 2] = (pel)((((R3 + R2 + R1) << 1) + R0 + L0 + 4) >> 3);                          //R2
            break;
        case 3:
            src[-2] = (pel)((L2 * 3 + L1 * 8 + L0 * 4 + R0 + 8) >> 4);                           //L1
            src[-1] = (pel)((L2 + (L1 << 2) + (L0 << 2) + (L0 << 1) + (R0 << 2) + R1 + 8) >> 4); //L0
            src[ 0] = (pel)((L1 + (L0 << 2) + (R0 << 2) + (R0 << 1) + (R1 << 2) + R2 + 8) >> 4); //R0
            src[ 1] = (pel)((R2 * 3 + R1 * 8 + R0 * 4 + L0 + 8) >> 4);                           //R1
            break;
        case 2:
            src[-1] = (pel)(((L1 << 1) + L1 + (L0 << 3) + (L0 << 1) + (R0 << 1) + R0 + 8) >> 4);
            src[ 0] = (pel)(((L0 << 1) + L0 + (R0 << 3) + (R0 << 1) + (R1 << 1) + R1 + 8) >> 4);
            break;
        case 1:
            src[-1] = (pel)((L0 * 3 + R0 + 2) >> 2);
            src[ 0] = (pel)((R0 * 3 + L0 + 2) >> 2);
            break;
        default:
            break;
        }
    }
}